

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrsmem.c
# Opt level: O2

int shared_init(int debug_msgs)

{
  undefined8 *puVar1;
  __mode_t __mask;
  char *pcVar2;
  SHARED_LTAB *pSVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  char buf [1000];
  
  shared_init_called = 1;
  shared_debug = debug_msgs;
  if (debug_msgs != 0) {
    printf("shared_init:");
  }
  shared_kbase = 0;
  pcVar2 = getenv("SHMEM_LIB_KEYBASE");
  if ((pcVar2 == (char *)0x0) || (shared_kbase = atoi(pcVar2), shared_kbase == 0)) {
    shared_kbase = 0xd5ce3b;
  }
  if (shared_debug != 0) {
    printf(" keybase=%d",(ulong)(uint)shared_kbase);
  }
  shared_maxseg = 0;
  pcVar2 = getenv("SHMEM_LIB_MAXSEG");
  if ((pcVar2 == (char *)0x0) || (shared_maxseg = atoi(pcVar2), shared_maxseg == 0)) {
    shared_maxseg = 0x10;
  }
  if (shared_debug != 0) {
    printf(" maxseg=%d",(ulong)(uint)shared_maxseg);
  }
  shared_range = shared_maxseg * 3;
  if (shared_fd == -1) {
    if (shared_debug != 0) {
      printf(" lockfileinit=");
    }
    snprintf(buf,1000,"%s.%d.%d","/tmp/.shmem-lockfile",(ulong)(uint)shared_kbase,
             (ulong)(uint)shared_maxseg);
    __mask = umask(0);
    shared_fd = open(buf,0x2c2,(ulong)(uint)shared_create_mode);
    umask(__mask);
    if (shared_fd == -1) {
      shared_fd = open(buf,0x202,(ulong)(uint)shared_create_mode);
      if (shared_fd == -1) {
        return 0x9e;
      }
      if (shared_debug != 0) {
        pcVar2 = "slave";
        goto LAB_00138d76;
      }
    }
    else if (shared_debug != 0) {
      pcVar2 = "master";
LAB_00138d76:
      printf(pcVar2);
    }
  }
  if (shared_gt_h == -1) {
    if (shared_debug != 0) {
      printf(" globalsharedtableinit=");
    }
    shared_gt_h = shmget(shared_kbase,(long)shared_maxseg * 0x1c,shared_create_mode | 0x600);
    if (shared_gt_h == -1) {
      shared_gt_h = shmget(shared_kbase,(long)shared_maxseg * 0x1c,shared_create_mode);
      if (shared_gt_h == -1) {
        return 0x9b;
      }
      shared_gt = (SHARED_GTAB *)shmat(shared_gt_h,(void *)0x0,0);
      if (shared_gt == (SHARED_GTAB *)0xffffffffffffffff) {
        return 0x9b;
      }
      if (shared_debug == 0) goto LAB_00138d86;
      pcVar2 = "slave";
    }
    else {
      iVar5 = 0;
      shared_gt = (SHARED_GTAB *)shmat(shared_gt_h,(void *)0x0,0);
      if (shared_gt == (SHARED_GTAB *)0xffffffffffffffff) {
        return 0x9b;
      }
      for (; iVar5 < shared_maxseg; iVar5 = iVar5 + 1) {
        shared_clear_entry(iVar5);
      }
      if (shared_debug == 0) goto LAB_00138d86;
      pcVar2 = "master";
    }
    printf(pcVar2);
  }
LAB_00138d86:
  if (shared_lt == (SHARED_LTAB *)0x0) {
    if (shared_debug != 0) {
      printf(" localtableinit=");
    }
    iVar5 = shared_maxseg;
    pSVar3 = (SHARED_LTAB *)malloc((long)shared_maxseg * 0x18);
    if (pSVar3 == (SHARED_LTAB *)0x0) {
      shared_lt = pSVar3;
      return 0x9c;
    }
    uVar4 = 0;
    uVar6 = (ulong)(uint)iVar5;
    if (iVar5 < 1) {
      uVar6 = uVar4;
    }
    shared_lt = pSVar3;
    for (; uVar6 * 0x18 - uVar4 != 0; uVar4 = uVar4 + 0x18) {
      puVar1 = (undefined8 *)((long)&pSVar3->p + uVar4);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)((long)&pSVar3->seekpos + uVar4) = 0;
    }
    if (shared_debug != 0) {
      printf("ok");
    }
  }
  atexit(shared_cleanup);
  if (shared_debug != 0) {
    puts(" <<done>>");
  }
  return 0;
}

Assistant:

int     shared_init(int debug_msgs)             /* initialize shared memory stuff, you have to call this routine once */
 { int i;
   char buf[1000], *p;
   mode_t oldumask;

   shared_init_called = 1;                      /* tell everybody no need to call us for the 2nd time */
   shared_debug = debug_msgs;                   /* set required debug mode */
   
   if (shared_debug) printf("shared_init:");

   shared_kbase = 0;                            /* adapt to current env. settings */
   if (NULL != (p = getenv(SHARED_ENV_KEYBASE))) shared_kbase = atoi(p);
   if (0 == shared_kbase) shared_kbase = SHARED_KEYBASE;
   if (shared_debug) printf(" keybase=%d", shared_kbase);

   shared_maxseg = 0;
   if (NULL != (p = getenv(SHARED_ENV_MAXSEG))) shared_maxseg = atoi(p);
   if (0 == shared_maxseg) shared_maxseg = SHARED_MAXSEG;
   if (shared_debug) printf(" maxseg=%d", shared_maxseg);
   
   shared_range = 3 * shared_maxseg;

   if (SHARED_INVALID == shared_fd)             /* create rw locking file (this file is never deleted) */
     { if (shared_debug) printf(" lockfileinit=");
       snprintf(buf, 1000,"%s.%d.%d", SHARED_FDNAME, shared_kbase, shared_maxseg);
       oldumask = umask(0);

       shared_fd = open(buf, O_TRUNC | O_EXCL | O_CREAT | O_RDWR, shared_create_mode);
       umask(oldumask);
       if (SHARED_INVALID == shared_fd)         /* or just open rw locking file, in case it already exists */
         { shared_fd = open(buf, O_TRUNC | O_RDWR, shared_create_mode);
           if (SHARED_INVALID == shared_fd) return(SHARED_NOFILE);
           if (shared_debug) printf("slave");

         }
       else
         { if (shared_debug) printf("master");
         }
     }

   if (SHARED_INVALID == shared_gt_h)           /* global table not attached, try to create it in shared memory */
     { if (shared_debug) printf(" globalsharedtableinit=");
       shared_gt_h = shmget(shared_kbase, shared_maxseg * sizeof(SHARED_GTAB), IPC_CREAT | IPC_EXCL | shared_create_mode); /* try open as a master */
       if (SHARED_INVALID == shared_gt_h)       /* if failed, try to open as a slave */
         { shared_gt_h = shmget(shared_kbase, shared_maxseg * sizeof(SHARED_GTAB), shared_create_mode);
           if (SHARED_INVALID == shared_gt_h) return(SHARED_IPCERR); /* means deleted ID residing in system, shared mem unusable ... */
           shared_gt = (SHARED_GTAB *)shmat(shared_gt_h, 0, 0); /* attach segment */
           if (((SHARED_GTAB *)SHARED_INVALID) == shared_gt) return(SHARED_IPCERR);
           if (shared_debug) printf("slave");
         }
       else
         { shared_gt = (SHARED_GTAB *)shmat(shared_gt_h, 0, 0); /* attach segment */
           if (((SHARED_GTAB *)SHARED_INVALID) == shared_gt) return(SHARED_IPCERR);
           for (i=0; i<shared_maxseg; i++) shared_clear_entry(i);       /* since we are master, init data */
           if (shared_debug) printf("master");
         }
     }

   if (NULL == shared_lt)                       /* initialize local table */
     { if (shared_debug) printf(" localtableinit=");
       if (NULL == (shared_lt = (SHARED_LTAB *)malloc(shared_maxseg * sizeof(SHARED_LTAB)))) return(SHARED_NOMEM);
       for (i=0; i<shared_maxseg; i++)
        { shared_lt[i].p = NULL;                /* not mapped */
          shared_lt[i].tcnt = 0;                /* unused (or zero threads using this seg) */
          shared_lt[i].lkcnt = 0;               /* segment is unlocked */
          shared_lt[i].seekpos = 0L;            /* r/w pointer at the beginning of file */
        }
       if (shared_debug) printf("ok");
     }

   atexit(shared_cleanup);                      /* we want shared_cleanup to be called at exit or abort */

   if (shared_debug) printf(" <<done>>\n");
   return(SHARED_OK);
 }